

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void P_RipperBlood(AActor *mo,AActor *bleeder)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint32 uVar5;
  DWORD DVar6;
  PClassActor *type;
  AActor *pAVar7;
  bool bVar8;
  undefined1 local_80 [16];
  TFlags<ActorFlag2,_unsigned_int> local_70;
  TFlags<ActorFlag5,_unsigned_int> local_6c;
  AActor *local_68;
  AActor *th;
  undefined1 local_58 [4];
  int bloodtype;
  DVector3 pos;
  double zo;
  double yo;
  double xo;
  PClassActor *bloodcls;
  AActor *pAStack_18;
  PalEntry bloodcolor;
  AActor *bleeder_local;
  AActor *mo_local;
  
  pAStack_18 = bleeder;
  bloodcls._4_4_ =
       (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
       AActor::GetBloodColor(bleeder);
  type = AActor::GetBloodType(pAStack_18,0);
  iVar1 = FRandom::Random2(&pr_ripperblood);
  iVar2 = FRandom::Random2(&pr_ripperblood);
  iVar3 = FRandom::Random2(&pr_ripperblood);
  pos.Z = (double)iVar3 / 16.0;
  AActor::Vec3Offset((DVector3 *)local_58,mo,(double)iVar1 / 16.0,(double)iVar2 / 16.0,pos.Z,false);
  th._4_4_ = FIntCVar::operator_cast_to_int(&cl_bloodtype);
  bVar8 = false;
  if (type != (PClassActor *)0x0) {
    pAVar7 = GetDefaultByType(&type->super_PClass);
    TFlags<ActorFlag4,_unsigned_int>::operator&
              ((TFlags<ActorFlag4,_unsigned_int> *)&th,
               (int)pAVar7 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&th);
    bVar8 = uVar4 == 0;
  }
  if (bVar8) {
    th._4_4_ = 0;
  }
  if (type != (PClassActor *)0x0) {
    local_68 = Spawn(type,(DVector3 *)local_58,NO_REPLACE);
    TFlags<ActorFlag5,_unsigned_int>::operator&
              (&local_6c,
               (int)local_68 +
               (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|MF5_NOFORWARDFALL|MF5_NODROPOFF));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_6c);
    if (uVar4 != 0) {
      TObjPtr<AActor>::operator=(&local_68->target,pAStack_18);
    }
    if (gameinfo.gametype == GAME_Heretic) {
      TFlags<ActorFlag,_unsigned_int>::operator|=(&local_68->flags,MF_NOGRAVITY);
    }
    (local_68->Vel).X = (mo->Vel).X / 2.0;
    (local_68->Vel).Y = (mo->Vel).Y / 2.0;
    uVar4 = FRandom::operator()(&pr_ripperblood);
    local_68->tics = (uVar4 & 3) + local_68->tics;
    uVar5 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)((long)&bloodcls + 4));
    bVar8 = false;
    if (uVar5 != 0) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_70,(int)local_68 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
      uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_70);
      bVar8 = uVar4 == 0;
    }
    if (bVar8) {
      DVar6 = TRANSLATION('\b',bloodcls._4_4_ >> 0x18);
      local_68->Translation = DVar6;
    }
    if (1 < th._4_4_) {
      TFlags<ActorRenderFlag,_unsigned_int>::operator|=(&local_68->renderflags,RF_INVISIBLE);
    }
  }
  if (0 < th._4_4_) {
    AActor::AngleTo((AActor *)local_80,pAStack_18,SUB81(mo,0));
    TAngle<double>::operator+((TAngle<double> *)(local_80 + 8),180.0);
    uVar5 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)((long)&bloodcls + 4));
    P_DrawSplash2(0x1c,(DVector3 *)local_58,(DAngle *)(local_80 + 8),0,uVar5);
  }
  return;
}

Assistant:

void P_RipperBlood (AActor *mo, AActor *bleeder)
{
	PalEntry bloodcolor = bleeder->GetBloodColor();
	PClassActor *bloodcls = bleeder->GetBloodType();

	double xo = pr_ripperblood.Random2() / 16.;
	double yo = pr_ripperblood.Random2() / 16.;
	double zo = pr_ripperblood.Random2() / 16.;
	DVector3 pos = mo->Vec3Offset(xo, yo, zo);

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	if (bloodcls != NULL)
	{
		AActor *th;
		th = Spawn (bloodcls, pos, NO_REPLACE); // GetBloodType already performed the replacement
		// [NG] Applying PUFFGETSOWNER to the blood will make it target the owner
		if (th->flags5 & MF5_PUFFGETSOWNER) th->target = bleeder;
		if (gameinfo.gametype == GAME_Heretic)
			th->flags |= MF_NOGRAVITY;
		th->Vel.X = mo->Vel.X / 2;
		th->Vel.Y = mo->Vel.Y / 2;
		th->tics += pr_ripperblood () & 3;

		// colorize the blood!
		if (bloodcolor!=0 && !(th->flags2 & MF2_DONTTRANSLATE))
		{
			th->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}

		if (!(bloodtype <= 1)) th->renderflags |= RF_INVISIBLE;
	}
	if (bloodtype >= 1)
	{
		P_DrawSplash2(28, pos, bleeder->AngleTo(mo) + 180., 0, bloodcolor);
	}
}